

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_free(void *msp,void *ptr)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  uint *puVar9;
  ulong *puVar10;
  byte bVar11;
  long in_RSI;
  uint *in_RDI;
  bool bVar12;
  tchunkptr F_5;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I_3;
  tbinptr *H_2;
  tchunkptr tp;
  mchunkptr F_4;
  mchunkptr B_2;
  bindex_t I_2;
  tchunkptr C1_1;
  tchunkptr C0_1;
  tbinptr *H_1;
  tchunkptr *CP_1;
  tchunkptr *RP_1;
  tchunkptr F_3;
  tchunkptr R_1;
  tchunkptr XP_1;
  tchunkptr TP_1;
  bindex_t I_1;
  mchunkptr B_1;
  mchunkptr F_2;
  size_t nsize;
  size_t dsize;
  size_t tsize;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F_1;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr TP;
  bindex_t I;
  mchunkptr B;
  mchunkptr F;
  mchunkptr prev;
  size_t prevsize;
  mchunkptr next;
  size_t psize;
  mstate fm;
  mchunkptr p;
  int ret;
  int olderr;
  byte local_1a8;
  size_t in_stack_fffffffffffffe80;
  mstate in_stack_fffffffffffffe88;
  ulong uVar13;
  ulong local_168;
  uint *local_150;
  long *local_120;
  long *local_118;
  long local_108;
  mstate in_stack_ffffffffffffff48;
  ulong *local_a8;
  ulong *local_a0;
  ulong local_90;
  ulong local_48;
  ulong *local_38;
  
  if (in_RSI == 0) {
    return (void *)0x0;
  }
  local_38 = (ulong *)(in_RSI + -0x10);
  local_48 = *(ulong *)(in_RSI + -8) & 0xfffffffffffffffc;
  lVar7 = (long)local_38 + local_48;
  if ((*(ulong *)(in_RSI + -8) & 1) == 0) {
    uVar13 = *local_38;
    if ((uVar13 & 1) != 0) {
      piVar8 = __errno_location();
      iVar1 = *piVar8;
      munmap((void *)((long)local_38 - (uVar13 & 0xfffffffffffffffe)),
             (uVar13 & 0xfffffffffffffffe) + 0x20 + local_48);
      piVar8 = __errno_location();
      *piVar8 = iVar1;
      return (void *)0x0;
    }
    local_38 = (ulong *)((long)local_38 - uVar13);
    local_48 = uVar13 + local_48;
    if (local_38 == *(ulong **)(in_RDI + 6)) {
      if ((*(ulong *)(lVar7 + 8) & 3) == 3) {
        *(ulong *)(in_RDI + 2) = local_48;
        *(ulong *)(lVar7 + 8) = *(ulong *)(lVar7 + 8) & 0xfffffffffffffffe;
        local_38[1] = local_48 | 1;
        *(ulong *)((long)local_38 + local_48) = local_48;
        return (void *)0x0;
      }
    }
    else if (uVar13 >> 3 < 0x20) {
      uVar2 = local_38[2];
      uVar3 = local_38[3];
      if (uVar2 == uVar3) {
        *in_RDI = (1 << ((byte)(uVar13 >> 3) & 0x1f) ^ 0xffffffffU) & *in_RDI;
      }
      else {
        *(ulong *)(uVar2 + 0x18) = uVar3;
        *(ulong *)(uVar3 + 0x10) = uVar2;
      }
    }
    else {
      uVar13 = local_38[6];
      if ((ulong *)local_38[3] == local_38) {
        local_a0 = local_38 + 5;
        local_90 = local_38[5];
        if (local_90 == 0) {
          local_a0 = local_38 + 4;
          local_90 = local_38[4];
          if (local_90 == 0) goto LAB_0017ed6d;
        }
        while( true ) {
          local_a8 = (ulong *)(local_90 + 0x28);
          bVar12 = true;
          if (*(long *)(local_90 + 0x28) == 0) {
            local_a8 = (ulong *)(local_90 + 0x20);
            bVar12 = *(long *)(local_90 + 0x20) != 0;
          }
          if (!bVar12) break;
          local_a0 = local_a8;
          local_90 = *local_a8;
        }
        *local_a0 = 0;
      }
      else {
        uVar2 = local_38[2];
        local_90 = local_38[3];
        *(ulong *)(uVar2 + 0x18) = local_90;
        *(ulong *)(local_90 + 0x10) = uVar2;
      }
LAB_0017ed6d:
      if (uVar13 != 0) {
        if (local_38 == *(ulong **)(in_RDI + local_38[7] * 2 + 0x92)) {
          *(ulong *)(in_RDI + local_38[7] * 2 + 0x92) = local_90;
          if (local_90 == 0) {
            in_RDI[1] = (1 << ((byte)local_38[7] & 0x1f) ^ 0xffffffffU) & in_RDI[1];
          }
        }
        else if (*(ulong **)(uVar13 + 0x20) == local_38) {
          *(ulong *)(uVar13 + 0x20) = local_90;
        }
        else {
          *(ulong *)(uVar13 + 0x28) = local_90;
        }
        if (local_90 != 0) {
          *(ulong *)(local_90 + 0x30) = uVar13;
          in_stack_ffffffffffffff48 = (mstate)local_38[4];
          if (in_stack_ffffffffffffff48 != (mstate)0x0) {
            *(mstate *)(local_90 + 0x20) = in_stack_ffffffffffffff48;
            in_stack_ffffffffffffff48->release_checks = local_90;
          }
          uVar13 = local_38[5];
          if (uVar13 != 0) {
            *(ulong *)(local_90 + 0x28) = uVar13;
            *(ulong *)(uVar13 + 0x30) = local_90;
          }
        }
      }
    }
  }
  if ((*(ulong *)(lVar7 + 8) & 2) != 0) {
    *(ulong *)(lVar7 + 8) = *(ulong *)(lVar7 + 8) & 0xfffffffffffffffe;
    local_38[1] = local_48 | 1;
    *(ulong *)((long)local_38 + local_48) = local_48;
    goto LAB_0017f574;
  }
  if (lVar7 == *(long *)(in_RDI + 8)) {
    local_48 = local_48 + *(long *)(in_RDI + 4);
    *(ulong *)(in_RDI + 4) = local_48;
    *(ulong **)(in_RDI + 8) = local_38;
    local_38[1] = local_48 | 1;
    if (local_38 == *(ulong **)(in_RDI + 6)) {
      in_RDI[6] = 0;
      in_RDI[7] = 0;
      in_RDI[2] = 0;
      in_RDI[3] = 0;
    }
    if (local_48 <= *(ulong *)(in_RDI + 10)) {
      return (void *)0x0;
    }
    alloc_trim(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    return (void *)0x0;
  }
  if (lVar7 == *(long *)(in_RDI + 6)) {
    local_48 = local_48 + *(long *)(in_RDI + 2);
    *(ulong *)(in_RDI + 2) = local_48;
    *(ulong **)(in_RDI + 6) = local_38;
    local_38[1] = local_48 | 1;
    *(ulong *)((long)local_38 + local_48) = local_48;
    return (void *)0x0;
  }
  uVar13 = *(ulong *)(lVar7 + 8);
  local_48 = (uVar13 & 0xfffffffffffffffc) + local_48;
  if (uVar13 >> 3 < 0x20) {
    lVar4 = *(long *)(lVar7 + 0x10);
    lVar7 = *(long *)(lVar7 + 0x18);
    if (lVar4 == lVar7) {
      *in_RDI = (1 << ((byte)(uVar13 >> 3) & 0x1f) ^ 0xffffffffU) & *in_RDI;
    }
    else {
      *(long *)(lVar4 + 0x18) = lVar7;
      *(long *)(lVar7 + 0x10) = lVar4;
    }
  }
  else {
    lVar4 = *(long *)(lVar7 + 0x30);
    if (*(long *)(lVar7 + 0x18) == lVar7) {
      local_118 = (long *)(lVar7 + 0x28);
      local_108 = *(long *)(lVar7 + 0x28);
      if (local_108 == 0) {
        local_118 = (long *)(lVar7 + 0x20);
        local_108 = *(long *)(lVar7 + 0x20);
        if (local_108 == 0) goto LAB_0017f34a;
      }
      while( true ) {
        local_120 = (long *)(local_108 + 0x28);
        bVar12 = true;
        if (*(long *)(local_108 + 0x28) == 0) {
          local_120 = (long *)(local_108 + 0x20);
          bVar12 = *(long *)(local_108 + 0x20) != 0;
        }
        if (!bVar12) break;
        local_118 = local_120;
        local_108 = *local_120;
      }
      *local_118 = 0;
    }
    else {
      lVar5 = *(long *)(lVar7 + 0x10);
      local_108 = *(long *)(lVar7 + 0x18);
      *(long *)(lVar5 + 0x18) = local_108;
      *(long *)(local_108 + 0x10) = lVar5;
    }
LAB_0017f34a:
    if (lVar4 != 0) {
      if (lVar7 == *(long *)(in_RDI + *(long *)(lVar7 + 0x38) * 2 + 0x92)) {
        *(long *)(in_RDI + *(long *)(lVar7 + 0x38) * 2 + 0x92) = local_108;
        if (local_108 == 0) {
          in_RDI[1] = (1 << ((byte)*(undefined8 *)(lVar7 + 0x38) & 0x1f) ^ 0xffffffffU) & in_RDI[1];
        }
      }
      else if (*(long *)(lVar4 + 0x20) == lVar7) {
        *(long *)(lVar4 + 0x20) = local_108;
      }
      else {
        *(long *)(lVar4 + 0x28) = local_108;
      }
      if (local_108 != 0) {
        *(long *)(local_108 + 0x30) = lVar4;
        lVar4 = *(long *)(lVar7 + 0x20);
        if (lVar4 != 0) {
          *(long *)(local_108 + 0x20) = lVar4;
          *(long *)(lVar4 + 0x30) = local_108;
        }
        lVar7 = *(long *)(lVar7 + 0x28);
        if (lVar7 != 0) {
          *(long *)(local_108 + 0x28) = lVar7;
          *(long *)(lVar7 + 0x30) = local_108;
        }
      }
    }
  }
  local_38[1] = local_48 | 1;
  *(ulong *)((long)local_38 + local_48) = local_48;
  if (local_38 == *(ulong **)(in_RDI + 6)) {
    *(ulong *)(in_RDI + 2) = local_48;
    return (void *)0x0;
  }
LAB_0017f574:
  if (local_48 >> 3 < 0x20) {
    puVar9 = in_RDI + (local_48 >> 3) * 4 + 0xe;
    bVar11 = (byte)(local_48 >> 3);
    if ((*in_RDI & 1 << (bVar11 & 0x1f)) == 0) {
      *in_RDI = 1 << (bVar11 & 0x1f) | *in_RDI;
      local_150 = puVar9;
    }
    else {
      local_150 = *(uint **)(puVar9 + 4);
    }
    *(ulong **)(puVar9 + 4) = local_38;
    *(ulong **)(local_150 + 6) = local_38;
    local_38[2] = (ulong)local_150;
    local_38[3] = (ulong)puVar9;
  }
  else {
    uVar6 = (uint)(local_48 >> 8);
    if (uVar6 == 0) {
      local_168 = 0;
    }
    else if (uVar6 < 0x10000) {
      iVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      local_168 = (ulong)(uint)(iVar1 << 1) + (local_48 >> ((char)iVar1 + 7U & 0x3f) & 1);
    }
    else {
      local_168 = 0x1f;
    }
    puVar10 = (ulong *)(in_RDI + local_168 * 2 + 0x92);
    local_38[7] = local_168;
    local_38[5] = 0;
    local_38[4] = 0;
    if ((in_RDI[1] & 1 << ((byte)local_168 & 0x1f)) == 0) {
      in_RDI[1] = 1 << ((byte)local_168 & 0x1f) | in_RDI[1];
      *puVar10 = (ulong)local_38;
      local_38[6] = (ulong)puVar10;
      local_38[3] = (ulong)local_38;
      local_38[2] = (ulong)local_38;
    }
    else {
      uVar13 = *puVar10;
      if (local_168 == 0x1f) {
        local_1a8 = 0;
      }
      else {
        local_1a8 = 0x3f - ((char)(local_168 >> 1) + '\x06');
      }
      lVar7 = local_48 << (local_1a8 & 0x3f);
      while ((*(ulong *)(uVar13 + 8) & 0xfffffffffffffffc) != local_48) {
        puVar10 = (ulong *)(uVar13 + 0x20 + (lVar7 >> 0x3f) * -8);
        lVar7 = lVar7 << 1;
        if (*puVar10 == 0) {
          *puVar10 = (ulong)local_38;
          local_38[6] = uVar13;
          local_38[3] = (ulong)local_38;
          local_38[2] = (ulong)local_38;
          goto LAB_0017f8db;
        }
        uVar13 = *puVar10;
      }
      uVar2 = *(ulong *)(uVar13 + 0x10);
      *(ulong **)(uVar2 + 0x18) = local_38;
      *(ulong **)(uVar13 + 0x10) = local_38;
      local_38[2] = uVar2;
      local_38[3] = uVar13;
      local_38[6] = 0;
    }
LAB_0017f8db:
    lVar7 = *(long *)(in_RDI + 0xc);
    *(long *)(in_RDI + 0xc) = lVar7 + -1;
    if (lVar7 + -1 == 0) {
      release_unused_segments(in_stack_ffffffffffffff48);
    }
  }
  return (void *)0x0;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_free(void *msp, void *ptr)
{
  if (ptr != 0) {
    mchunkptr p = mem2chunk(ptr);
    mstate fm = (mstate)msp;
    size_t psize = chunksize(p);
    mchunkptr next = chunk_plus_offset(p, psize);
    if (!pinuse(p)) {
      size_t prevsize = p->prev_foot;
      if ((prevsize & IS_DIRECT_BIT) != 0) {
	prevsize &= ~IS_DIRECT_BIT;
	psize += prevsize + DIRECT_FOOT_PAD;
	CALL_MUNMAP((char *)p - prevsize, psize);
	return NULL;
      } else {
	mchunkptr prev = chunk_minus_offset(p, prevsize);
	psize += prevsize;
	p = prev;
	/* consolidate backward */
	if (p != fm->dv) {
	  unlink_chunk(fm, p, prevsize);
	} else if ((next->head & INUSE_BITS) == INUSE_BITS) {
	  fm->dvsize = psize;
	  set_free_with_pinuse(p, psize, next);
	  return NULL;
	}
      }
    }
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == fm->top) {
	size_t tsize = fm->topsize += psize;
	fm->top = p;
	p->head = tsize | PINUSE_BIT;
	if (p == fm->dv) {
	  fm->dv = 0;
	  fm->dvsize = 0;
	}
	if (tsize > fm->trim_check)
	  alloc_trim(fm, 0);
	return NULL;
      } else if (next == fm->dv) {
	size_t dsize = fm->dvsize += psize;
	fm->dv = p;
	set_size_and_pinuse_of_free_chunk(p, dsize);
	return NULL;
      } else {
	size_t nsize = chunksize(next);
	psize += nsize;
	unlink_chunk(fm, next, nsize);
	set_size_and_pinuse_of_free_chunk(p, psize);
	if (p == fm->dv) {
	  fm->dvsize = psize;
	  return NULL;
	}
      }
    } else {
      set_free_with_pinuse(p, psize, next);
    }

    if (is_small(psize)) {
      insert_small_chunk(fm, p, psize);
    } else {
      tchunkptr tp = (tchunkptr)p;
      insert_large_chunk(fm, tp, psize);
      if (--fm->release_checks == 0)
	release_unused_segments(fm);
    }
  }
  return NULL;
}